

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_comparison_unit.c
# Opt level: O0

void generic_subset_test(uint8_t type1,uint8_t type2)

{
  container_t *result;
  char *expression;
  undefined1 in_SIL;
  undefined1 in_DIL;
  int i_2;
  int i_1;
  int i;
  container_t *container2;
  container_t *container1;
  int in_stack_ffffffffffffffdc;
  int line;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar2;
  undefined6 in_stack_fffffffffffffff8;
  
  result = container_create((uint8_t)((uint)in_stack_ffffffffffffffe4 >> 0x18));
  expression = (char *)container_create((uint8_t)((uint)in_stack_ffffffffffffffe4 >> 0x18));
  container_is_subset((container_t *)CONCAT17(in_DIL,CONCAT16(in_SIL,in_stack_fffffffffffffff8)),
                      (uint8_t)((ulong)result >> 0x38),expression,
                      (uint8_t)((uint)in_stack_ffffffffffffffe4 >> 0x18));
  _assert_true((unsigned_long)result,expression,
               (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc);
  for (iVar2 = 0; iVar2 < 100; iVar2 = iVar2 + 1) {
    container_checked_add
              ((container_t *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
               (uint16_t)((uint)in_stack_ffffffffffffffdc >> 0x10),
               (uint8_t)((uint)in_stack_ffffffffffffffdc >> 8));
    container_checked_add
              ((container_t *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
               (uint16_t)((uint)in_stack_ffffffffffffffdc >> 0x10),
               (uint8_t)((uint)in_stack_ffffffffffffffdc >> 8));
    container_is_subset((container_t *)CONCAT17(in_DIL,CONCAT16(in_SIL,in_stack_fffffffffffffff8)),
                        (uint8_t)((ulong)result >> 0x38),expression,(uint8_t)((uint)iVar2 >> 0x18));
    _assert_true((unsigned_long)result,expression,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
  }
  for (iVar1 = 0; iVar1 < 100; iVar1 = iVar1 + 1) {
    container_checked_add
              ((container_t *)CONCAT44(iVar2,iVar1),
               (uint16_t)((uint)in_stack_ffffffffffffffdc >> 0x10),
               (uint8_t)((uint)in_stack_ffffffffffffffdc >> 8));
    container_is_subset((container_t *)CONCAT17(in_DIL,CONCAT16(in_SIL,in_stack_fffffffffffffff8)),
                        (uint8_t)((ulong)result >> 0x38),expression,(uint8_t)((uint)iVar2 >> 0x18));
    _assert_true((unsigned_long)result,expression,(char *)CONCAT44(iVar2,iVar1),
                 in_stack_ffffffffffffffdc);
  }
  for (line = 0; line < 100; line = line + 1) {
    if ((line % 7 != 0) && (line % 0xb != 0)) {
      container_checked_add
                ((container_t *)CONCAT44(iVar2,iVar1),(uint16_t)((uint)line >> 0x10),
                 (uint8_t)((uint)line >> 8));
      container_is_subset((container_t *)CONCAT17(in_DIL,CONCAT16(in_SIL,in_stack_fffffffffffffff8))
                          ,(uint8_t)((ulong)result >> 0x38),expression,
                          (uint8_t)((uint)iVar2 >> 0x18));
      _assert_true((unsigned_long)result,expression,(char *)CONCAT44(iVar2,iVar1),line);
      container_checked_add
                ((container_t *)CONCAT44(iVar2,iVar1),(uint16_t)((uint)line >> 0x10),
                 (uint8_t)((uint)line >> 8));
      container_is_subset((container_t *)CONCAT17(in_DIL,CONCAT16(in_SIL,in_stack_fffffffffffffff8))
                          ,(uint8_t)((ulong)result >> 0x38),expression,
                          (uint8_t)((uint)iVar2 >> 0x18));
      _assert_true((unsigned_long)result,expression,(char *)CONCAT44(iVar2,iVar1),line);
    }
  }
  container_free((container_t *)CONCAT44(iVar2,iVar1),(uint8_t)((uint)line >> 0x18));
  container_free((container_t *)CONCAT44(iVar2,iVar1),(uint8_t)((uint)line >> 0x18));
  return;
}

Assistant:

void generic_subset_test(uint8_t type1, uint8_t type2) {
    container_t *container1 = container_create(type1);
    container_t *container2 = container_create(type2);
    assert_true(container_is_subset(container1, type1, container2, type2));
    for (int i = 0; i < 100; i++) {
        container_checked_add(container1, i * 11, type1);
        container_checked_add(container2, i * 11, type2);
        assert_true(container_is_subset(container1, type1, container2, type2));
    }
    for (int i = 0; i < 100; i++) {
        container_checked_add(container2, i * 7, type2);
        assert_true(container_is_subset(container1, type1, container2, type2));
    }
    for (int i = 0; i < 100; i++) {
        if (i % 7 == 0 || i % 11 == 0) continue;
        container_checked_add(container1, i * 5, type1);
        assert_false(container_is_subset(container1, type1, container2, type2));
        container_checked_add(container2, i * 5, type2);
        assert_true(container_is_subset(container1, type1, container2, type2));
    }
    container_free(container1, type1);
    container_free(container2, type2);
}